

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

int Maj3_ManFindFanin(Maj3_Man_t *p,int i,int *pFanins)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  p->nLits[2] = 0;
  p->nLits[0] = 0;
  p->nLits[1] = 0;
  if (i < 1) {
    iVar4 = 0;
  }
  else {
    uVar6 = (ulong)(uint)i;
    uVar5 = 0;
    iVar4 = 0;
    do {
      iVar1 = p->VarMarks[uVar6][uVar5];
      if (-1 < iVar1) {
        if (iVar1 == 1) {
          p->nLits[2] = p->nLits[2] + 1;
        }
        else {
          if (iVar1 == 0) {
            __assert_fail("p->VarMarks[i][f] > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                          ,0xb2,"int Maj3_ManFindFanin(Maj3_Man_t *, int, int *)");
          }
          iVar2 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar1);
          iVar1 = p->VarMarks[uVar6][uVar5];
          if (iVar2 == 0) {
            if (iVar1 < 0) goto LAB_005ada49;
            iVar2 = p->nLits[0];
            p->nLits[0] = iVar2 + 1;
            p->pLits[0][iVar2] = iVar1 * 2;
            goto LAB_005ada0b;
          }
          if (iVar1 < 0) {
LAB_005ada49:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          iVar2 = p->nLits[1];
          p->nLits[1] = iVar2 + 1;
          p->nLits[(long)iVar2 + -0x20] = iVar1 * 2 + 1;
        }
        lVar3 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pFanins[lVar3] = (int)uVar5;
      }
LAB_005ada0b:
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  return iVar4;
}

Assistant:

static inline int Maj3_ManFindFanin( Maj3_Man_t * p, int i, int * pFanins )
{
    int f, nFanins = 0;
    p->nLits[0] = p->nLits[1] = p->nLits[2] = 0;
    for ( f = 0; f < i; f++ )
    {
        if ( p->VarMarks[i][f] < 0 )
            continue;
        assert( p->VarMarks[i][f] > 0 );
        if ( p->VarMarks[i][f] == 1 ) // fixed
        {
            p->nLits[2]++;
            pFanins[nFanins++] = f;
        }
        else if ( bmcg_sat_solver_read_cex_varvalue(p->pSat, p->VarMarks[i][f]) ) // pos
        {
            p->pLits[1][p->nLits[1]++] = Abc_Var2Lit(p->VarMarks[i][f], 1);
            pFanins[nFanins++] = f;
        }
        else // neg
            p->pLits[0][p->nLits[0]++] = Abc_Var2Lit(p->VarMarks[i][f], 0);
    }
    return nFanins;
}